

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceQueueFamilyProperties2
          (TestStatus *__return_storage_ptr__,Context *context)

{
  allocator<vk::VkQueueFamilyProperties> *this;
  RefData<vk::VkInstance_s_*> data;
  size_t sVar1;
  VkAllocationCallbacks *platformInterface;
  deBool dVar2;
  int iVar3;
  VkInstance_s **ppVVar4;
  VkPhysicalDevice pVVar5;
  const_reference ppVVar6;
  TestError *pTVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  allocator<char> local_2a1;
  string local_2a0;
  ulong local_280;
  size_t ndx_1;
  size_t ndx;
  undefined1 local_268 [8];
  vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
  extProperties;
  undefined1 local_248 [8];
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> coreProperties;
  deUint32 numExtQueueFamilies;
  deUint32 numCoreQueueFamilies;
  VkPhysicalDevice physicalDevice;
  size_t deviceNdx;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  Move<vk::VkInstance_s_*> local_68;
  RefData<vk::VkInstance_s_*> local_50;
  undefined1 local_38 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *vkp;
  Context *context_local;
  
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  createInstanceWithExtension
            (&local_68,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             "VK_KHR_get_physical_device_properties2");
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_68);
  data.deleter.m_destroyInstance = local_50.deleter.m_destroyInstance;
  data.object = local_50.object;
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_38,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_68);
  platformInterface = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (PlatformInterface *)platformInterface,*ppVVar4);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &deviceNdx,
             (InstanceInterface *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar4);
  physicalDevice = (VkPhysicalDevice)0x0;
  do {
    pVVar5 = (VkPhysicalDevice)
             std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                       ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                         *)&deviceNdx);
    if (pVVar5 <= physicalDevice) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"Querying device queue family properties succeeded",&local_2a1
                );
      tcu::TestStatus::pass(__return_storage_ptr__,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
                ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                 &deviceNdx);
      ::vk::InstanceDriver::~InstanceDriver
                ((InstanceDriver *)
                 &devices.
                  super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_38);
      return __return_storage_ptr__;
    }
    ppVVar6 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,(size_type)physicalDevice);
    pVVar5 = *ppVVar6;
    coreProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
    coreProperties.
    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5,
               (deUint32 *)
               ((long)&coreProperties.
                       super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (VkQueueFamilyProperties *)0x0);
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties2KHR
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5,
               (deUint32 *)
               &coreProperties.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (VkQueueFamilyProperties2KHR *)0x0);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) ||
         (coreProperties.
          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ !=
          (uint)coreProperties.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Different number of queue family properties reported",
                   "numCoreQueueFamilies == numExtQueueFamilies",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x918);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) ||
         (coreProperties.
          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,(char *)0x0,"numCoreQueueFamilies > 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x919);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    uVar8 = (ulong)coreProperties.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    this = (allocator<vk::VkQueueFamilyProperties> *)
           ((long)&extProperties.
                   super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<vk::VkQueueFamilyProperties>::allocator(this);
    std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::vector
              ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
               local_248,uVar8,this);
    std::allocator<vk::VkQueueFamilyProperties>::~allocator
              ((allocator<vk::VkQueueFamilyProperties> *)
               ((long)&extProperties.
                       super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar8 = (ulong)(uint)coreProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<vk::VkQueueFamilyProperties2KHR>::allocator
              ((allocator<vk::VkQueueFamilyProperties2KHR> *)((long)&ndx + 7));
    std::vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>::
    vector((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
            *)local_268,uVar8,(allocator<vk::VkQueueFamilyProperties2KHR> *)((long)&ndx + 7));
    std::allocator<vk::VkQueueFamilyProperties2KHR>::~allocator
              ((allocator<vk::VkQueueFamilyProperties2KHR> *)((long)&ndx + 7));
    pvVar9 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ::operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)local_248,0);
    ::deMemset(pvVar9,0xcd,
               (ulong)coreProperties.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0x18);
    pvVar10 = std::
              vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
              ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                            *)local_268,0);
    ::deMemset(pvVar10,0xcd,
               (ulong)(uint)coreProperties.
                            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x28);
    for (ndx_1 = 0; sVar1 = ndx_1,
        sVar11 = std::
                 vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                 ::size((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                         *)local_268), sVar1 < sVar11; ndx_1 = ndx_1 + 1) {
      pvVar10 = std::
                vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                              *)local_268,ndx_1);
      pvVar10->sType = VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR;
      pvVar10 = std::
                vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                              *)local_268,ndx_1);
      pvVar10->pNext = (void *)0x0;
    }
    pvVar9 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ::operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)local_248,0);
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5,
               (deUint32 *)
               ((long)&coreProperties.
                       super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pvVar9);
    pvVar10 = std::
              vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
              ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                            *)local_268,0);
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties2KHR
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5,
               (deUint32 *)
               &coreProperties.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar10);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) ||
         (uVar8 = (ulong)coreProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
         sVar11 = std::
                  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  ::size((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          *)local_248), uVar8 != sVar11)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,(char *)0x0,"(size_t)numCoreQueueFamilies == coreProperties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x92b);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) ||
         (uVar8 = (ulong)(uint)coreProperties.
                               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
         sVar11 = std::
                  vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                  ::size((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                          *)local_268), uVar8 != sVar11)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,(char *)0x0,"(size_t)numExtQueueFamilies == extProperties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x92c);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    for (local_280 = 0; uVar8 = local_280,
        sVar11 = std::
                 vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                 ::size((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                         *)local_268), uVar8 < sVar11; local_280 = local_280 + 1) {
      do {
        dVar2 = ::deGetFalse();
        if ((dVar2 != 0) ||
           (pvVar10 = std::
                      vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                      ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                                    *)local_268,local_280),
           pvVar10->sType != VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR)) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,(char *)0x0,
                     "extProperties[ndx].sType == VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x931);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      do {
        dVar2 = ::deGetFalse();
        if ((dVar2 != 0) ||
           (pvVar10 = std::
                      vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                      ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                                    *)local_268,local_280), pvVar10->pNext != (void *)0x0)) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,(char *)0x0,"extProperties[ndx].pNext == DE_NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x932);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pvVar9 = std::
               vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
               operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)local_248,local_280);
      pvVar10 = std::
                vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                ::operator[]((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                              *)local_268,local_280);
      iVar3 = deMemCmp(pvVar9,&pvVar10->queueFamilyProperties,0x18);
      if (iVar3 != 0) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,
                   "Mismatch between format properties reported by vkGetPhysicalDeviceQueueFamilyProperties and vkGetPhysicalDeviceQueueFamilyProperties2KHR"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x935);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    std::vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>::
    ~vector((vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
             *)local_268);
    std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
              ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
               local_248);
    physicalDevice = physicalDevice + 1;
  } while( true );
}

Assistant:

tcu::TestStatus deviceQueueFamilyProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice	physicalDevice			= devices[deviceNdx];
		deUint32				numCoreQueueFamilies	= ~0u;
		deUint32				numExtQueueFamilies		= ~0u;

		vki.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numCoreQueueFamilies, DE_NULL);
		vki.getPhysicalDeviceQueueFamilyProperties2KHR(physicalDevice, &numExtQueueFamilies, DE_NULL);

		TCU_CHECK_MSG(numCoreQueueFamilies == numExtQueueFamilies, "Different number of queue family properties reported");
		TCU_CHECK(numCoreQueueFamilies > 0);

		{
			std::vector<VkQueueFamilyProperties>		coreProperties	(numCoreQueueFamilies);
			std::vector<VkQueueFamilyProperties2KHR>	extProperties	(numExtQueueFamilies);

			deMemset(&coreProperties[0], 0xcd, sizeof(VkQueueFamilyProperties)*numCoreQueueFamilies);
			deMemset(&extProperties[0], 0xcd, sizeof(VkQueueFamilyProperties2KHR)*numExtQueueFamilies);

			for (size_t ndx = 0; ndx < extProperties.size(); ++ndx)
			{
				extProperties[ndx].sType = VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR;
				extProperties[ndx].pNext = DE_NULL;
			}

			vki.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numCoreQueueFamilies, &coreProperties[0]);
			vki.getPhysicalDeviceQueueFamilyProperties2KHR(physicalDevice, &numExtQueueFamilies, &extProperties[0]);

			TCU_CHECK((size_t)numCoreQueueFamilies == coreProperties.size());
			TCU_CHECK((size_t)numExtQueueFamilies == extProperties.size());
			DE_ASSERT(numCoreQueueFamilies == numExtQueueFamilies);

			for (size_t ndx = 0; ndx < extProperties.size(); ++ndx)
			{
				TCU_CHECK(extProperties[ndx].sType == VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR);
				TCU_CHECK(extProperties[ndx].pNext == DE_NULL);

				if (deMemCmp(&coreProperties[ndx], &extProperties[ndx].queueFamilyProperties, sizeof(VkQueueFamilyProperties)) != 0)
					TCU_FAIL("Mismatch between format properties reported by vkGetPhysicalDeviceQueueFamilyProperties and vkGetPhysicalDeviceQueueFamilyProperties2KHR");
			}
		}
	}

	return tcu::TestStatus::pass("Querying device queue family properties succeeded");
}